

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O2

Variant * Jinx::Impl::CallWith(Variant *__return_storage_ptr__,ScriptPtr *script,Parameters *params)

{
  pointer pVVar1;
  _Rb_tree_node_base *p_Var2;
  RuntimeID id;
  char *message;
  ScriptIPtr s;
  Parameters fnParams;
  CollectionPtr collPtr;
  shared_ptr<Jinx::IScript> local_78;
  vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> local_68;
  undefined1 local_50 [16];
  vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> local_40;
  
  std::static_pointer_cast<Jinx::Impl::Script,Jinx::IScript>(&local_78);
  pVVar1 = (params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pVVar1 == (params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>)._M_impl
                .super__Vector_impl_data._M_finish) {
    message = "\'call with\' function invoked with no parameters";
  }
  else {
    if (pVVar1->m_type == Function) {
      local_68.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (pVVar1[1].m_type == Collection) {
        Jinx::Variant::GetCollection((Variant *)local_50);
        for (p_Var2 = *(_Rb_tree_node_base **)(local_50._0_8_ + 0x18);
            p_Var2 != (_Rb_tree_node_base *)(local_50._0_8_ + 8);
            p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
          std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::push_back
                    (&local_68,(value_type *)&p_Var2[2]._M_parent);
        }
        Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
      }
      else {
        std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::push_back(&local_68,pVVar1 + 1)
        ;
      }
      id = Jinx::Variant::GetFunction
                     ((params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>).
                      _M_impl.super__Vector_impl_data._M_start);
      std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::vector(&local_40,&local_68);
      Script::CallFunction
                (__return_storage_ptr__,
                 (Script *)
                 local_78.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_ptr,id,
                 &local_40);
      std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::~vector(&local_40);
      std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::~vector(&local_68);
      goto LAB_001c941d;
    }
    message = "Invalid parameters to \'call with\' function";
  }
  Script::Error((Script *)
                local_78.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                message);
  __return_storage_ptr__->m_type = Null;
  Jinx::Variant::SetNull(__return_storage_ptr__);
LAB_001c941d:
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_78.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant CallWith(ScriptPtr script, const Parameters & params)
	{
		ScriptIPtr s = std::static_pointer_cast<Script>(script);
		if (params.empty())
		{
			s->Error("'call with' function invoked with no parameters");
			return nullptr;
		}
		if (!params[0].IsFunction())
		{
			s->Error("Invalid parameters to 'call with' function");
			return nullptr;
		}
		Parameters fnParams;
		if (params[1].IsCollection())
		{
			auto collPtr = params[1].GetCollection();
			auto & coll = *collPtr;
			for (const auto & pair : coll)
				fnParams.push_back(pair.second);
		}
		else
		{
			fnParams.push_back(params[1]);
		}
		return s->CallFunction(params[0].GetFunction(), fnParams);
	}